

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
          (SubscriptionSync *this,SubscriptionSync *to_move)

{
  SubscriptionSync *to_move_local;
  SubscriptionSync *this_local;
  
  PixieMessage::PixieMessage(&this->super_PixieMessage);
  (this->super_PixieMessage)._vptr_PixieMessage = (_func_int **)&PTR_Encode_003a3ac0;
  this->options_ = 0;
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::map(&this->controls_);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&this->subjects_);
  this->edition_ = to_move->edition_;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::operator=(&this->subjects_,&to_move->subjects_);
  this->size_ = to_move->size_;
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::operator=(&this->controls_,&to_move->controls_);
  this->options_ = to_move->options_;
  return;
}

Assistant:

SubscriptionSync::SubscriptionSync(const SubscriptionSync&& to_move)
{
    edition_ = to_move.edition_;
    subjects_ = std::move(to_move.subjects_);
    size_ = to_move.size_;
    controls_ = std::move(to_move.controls_);
    options_ = to_move.options_;
}